

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int backupOnePage(sqlite3_backup *p,Pgno iSrcPg,u8 *zSrcData,int bUpdate)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Pgno v;
  void *pvVar4;
  undefined1 *puVar5;
  int in_ECX;
  Pager *in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  u8 *zOut;
  u8 *zDestData;
  u8 *zIn;
  Pgno iDest;
  i64 iOff;
  int rc;
  i64 iEnd;
  int nCopy;
  int nDestPgsz;
  int nSrcPgsz;
  Pager *pDestPager;
  DbPage *pDestPg;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uchar *in_stack_ffffffffffffff58;
  Pager *in_stack_ffffffffffffff60;
  int local_84;
  long local_60;
  int local_54;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sqlite3BtreePager(*(Btree **)(in_RDI + 8));
  iVar2 = sqlite3BtreeGetPageSize(*(Btree **)(in_RDI + 0x28));
  iVar3 = sqlite3BtreeGetPageSize(*(Btree **)(in_RDI + 8));
  local_84 = iVar3;
  if (iVar2 < iVar3) {
    local_84 = iVar2;
  }
  local_54 = 0;
  for (local_60 = (ulong)in_ESI * (long)iVar2 - (long)iVar2;
      local_54 == 0 && local_60 < (long)((ulong)in_ESI * (long)iVar2); local_60 = iVar3 + local_60)
  {
    if ((int)(local_60 / (long)iVar3) + 1 !=
        (uint)sqlite3PendingByte / *(uint *)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x34) + 1) {
      local_54 = sqlite3PagerGet(in_stack_ffffffffffffff60,
                                 (Pgno)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                 (DbPage **)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 in_stack_ffffffffffffff4c);
      if ((local_54 == 0) &&
         (local_54 = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffff4c,
                                                         in_stack_ffffffffffffff48)), local_54 == 0)
         ) {
        in_stack_ffffffffffffff60 = in_RDX;
        pvVar4 = sqlite3PagerGetData((DbPage *)0x0);
        pvVar4 = (void *)((long)pvVar4 + local_60 % (long)iVar3);
        memcpy(pvVar4,(void *)((long)&in_RDX->pVfs + local_60 % (long)iVar2),(long)local_84);
        puVar5 = (undefined1 *)sqlite3PagerGetExtra((DbPage *)0x0);
        *puVar5 = 0;
        if ((local_60 == 0) && (in_ECX == 0)) {
          in_stack_ffffffffffffff58 = (uchar *)((long)pvVar4 + 0x1c);
          v = sqlite3BtreeLastPage((Btree *)0x13c66b);
          sqlite3Put4byte(in_stack_ffffffffffffff58,v);
        }
      }
      sqlite3PagerUnref((DbPage *)0x13c686);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_54;
  }
  __stack_chk_fail();
}

Assistant:

static int backupOnePage(
  sqlite3_backup *p,              /* Backup handle */
  Pgno iSrcPg,                    /* Source database page to backup */
  const u8 *zSrcData,             /* Source database page data */
  int bUpdate                     /* True for an update, false otherwise */
){
  Pager * const pDestPager = sqlite3BtreePager(p->pDest);
  const int nSrcPgsz = sqlite3BtreeGetPageSize(p->pSrc);
  int nDestPgsz = sqlite3BtreeGetPageSize(p->pDest);
  const int nCopy = MIN(nSrcPgsz, nDestPgsz);
  const i64 iEnd = (i64)iSrcPg*(i64)nSrcPgsz;
  int rc = SQLITE_OK;
  i64 iOff;

  assert( sqlite3BtreeGetReserveNoMutex(p->pSrc)>=0 );
  assert( p->bDestLocked );
  assert( !isFatalError(p->rc) );
  assert( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) );
  assert( zSrcData );
  assert( nSrcPgsz==nDestPgsz || sqlite3PagerIsMemdb(pDestPager)==0 );

  /* This loop runs once for each destination page spanned by the source
  ** page. For each iteration, variable iOff is set to the byte offset
  ** of the destination page.
  */
  for(iOff=iEnd-(i64)nSrcPgsz; rc==SQLITE_OK && iOff<iEnd; iOff+=nDestPgsz){
    DbPage *pDestPg = 0;
    Pgno iDest = (Pgno)(iOff/nDestPgsz)+1;
    if( iDest==PENDING_BYTE_PAGE(p->pDest->pBt) ) continue;
    if( SQLITE_OK==(rc = sqlite3PagerGet(pDestPager, iDest, &pDestPg, 0))
     && SQLITE_OK==(rc = sqlite3PagerWrite(pDestPg))
    ){
      const u8 *zIn = &zSrcData[iOff%nSrcPgsz];
      u8 *zDestData = sqlite3PagerGetData(pDestPg);
      u8 *zOut = &zDestData[iOff%nDestPgsz];

      /* Copy the data from the source page into the destination page.
      ** Then clear the Btree layer MemPage.isInit flag. Both this module
      ** and the pager code use this trick (clearing the first byte
      ** of the page 'extra' space to invalidate the Btree layers
      ** cached parse of the page). MemPage.isInit is marked
      ** "MUST BE FIRST" for this purpose.
      */
      memcpy(zOut, zIn, nCopy);
      ((u8 *)sqlite3PagerGetExtra(pDestPg))[0] = 0;
      if( iOff==0 && bUpdate==0 ){
        sqlite3Put4byte(&zOut[28], sqlite3BtreeLastPage(p->pSrc));
      }
    }
    sqlite3PagerUnref(pDestPg);
  }

  return rc;
}